

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O3

size_t tdefl_compress_mem_to_mem
                 (void *pOut_buf,size_t out_buf_len,void *pSrc_buf,size_t src_buf_len,int flags)

{
  mz_bool mVar1;
  tdefl_output_buffer out_buf;
  size_t local_28;
  size_t sStack_20;
  void *local_18;
  undefined8 uStack_10;
  
  uStack_10 = 0;
  local_28 = 0;
  if ((pOut_buf == (void *)0x0) ||
     (sStack_20 = out_buf_len, local_18 = pOut_buf,
     mVar1 = tdefl_compress_mem_to_output
                       (pSrc_buf,src_buf_len,
                        (anonymous_namespace)::miniz::tdefl_output_buffer_putter,&local_28,flags),
     mVar1 == 0)) {
    local_28 = 0;
  }
  return local_28;
}

Assistant:

size_t tdefl_compress_mem_to_mem(void *pOut_buf, size_t out_buf_len,
                                 const void *pSrc_buf, size_t src_buf_len,
                                 int flags) {
  tdefl_output_buffer out_buf;
  MZ_CLEAR_OBJ(out_buf);
  if (!pOut_buf)
    return 0;
  out_buf.m_pBuf = (mz_uint8 *)pOut_buf;
  out_buf.m_capacity = out_buf_len;
  if (!tdefl_compress_mem_to_output(
          pSrc_buf, src_buf_len, tdefl_output_buffer_putter, &out_buf, flags))
    return 0;
  return out_buf.m_size;
}